

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O1

size_t __thiscall
edition_unittest::TestVerifyBigFieldNumberUint32_Nested::ByteSizeLong
          (TestVerifyBigFieldNumberUint32_Nested *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Rep *pRVar5;
  size_t sVar6;
  RepeatedPtrField<edition_unittest::TestVerifyBigFieldNumberUint32_Nested> *this_00;
  size_t sVar7;
  RepeatedPtrField<edition_unittest::TestVerifyBigFieldNumberUint32_Nested> *pRVar8;
  
  sVar7 = (size_t)*(int *)((long)&this->field_0 + 0x10);
  this_00 = &(this->field_0)._impl_.repeated_nested_;
  pRVar8 = this_00;
  if ((undefined1  [72])((undefined1  [72])this->field_0 & (undefined1  [72])0x1) !=
      (undefined1  [72])0x0) {
    pRVar5 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                       (&this_00->super_RepeatedPtrFieldBase);
    pRVar8 = (RepeatedPtrField<edition_unittest::TestVerifyBigFieldNumberUint32_Nested> *)
             pRVar5->elements;
  }
  if (((ulong)(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar5 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                       (&this_00->super_RepeatedPtrFieldBase);
    this_00 = (RepeatedPtrField<edition_unittest::TestVerifyBigFieldNumberUint32_Nested> *)
              pRVar5->elements;
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x10);
  for (; pRVar8 != (RepeatedPtrField<edition_unittest::TestVerifyBigFieldNumberUint32_Nested> *)
                   (&(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar8 = (RepeatedPtrField<edition_unittest::TestVerifyBigFieldNumberUint32_Nested> *)
               &(pRVar8->super_RepeatedPtrFieldBase).current_size_) {
    sVar6 = ByteSizeLong((TestVerifyBigFieldNumberUint32_Nested *)
                         (pRVar8->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar3 = (uint)sVar6 | 1;
    iVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar7 = sVar7 + sVar6 + (ulong)(iVar2 * 9 + 0x49U >> 6);
  }
  uVar3 = *(uint *)&this->field_0;
  if ((char)uVar3 != '\0') {
    if ((uVar3 & 1) != 0) {
      sVar6 = ByteSizeLong((this->field_0)._impl_.optional_nested_);
      uVar4 = (uint)sVar6 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar7 = sVar7 + sVar6 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar3 & 2) != 0) {
      uVar4 = (this->field_0)._impl_.optional_uint32_1_ | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar7 = sVar7 + (iVar1 * 9 + 0x89U >> 6);
    }
    if ((uVar3 & 4) != 0) {
      uVar4 = (this->field_0)._impl_.optional_uint32_2_ | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar7 = sVar7 + (iVar1 * 9 + 0x89U >> 6);
    }
    if ((uVar3 & 8) != 0) {
      uVar4 = (this->field_0)._impl_.optional_uint32_63_ | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar7 = sVar7 + (iVar1 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar3 & 0x10) != 0) {
      uVar4 = (this->field_0)._impl_.optional_uint32_64_ | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar7 = sVar7 + (iVar1 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar3 & 0x20) != 0) {
      uVar4 = (this->field_0)._impl_.optional_uint32_65_ | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar7 = sVar7 + (iVar1 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar3 & 0x40) != 0) {
      uVar4 = (this->field_0)._impl_.optional_uint32_66_ | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar7 = sVar7 + (iVar1 * 9 + 0x49U >> 6) + 2;
    }
    if ((char)uVar3 < '\0') {
      uVar4 = (this->field_0)._impl_.optional_uint32_1000_ | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar7 = sVar7 + (iVar1 * 9 + 0x49U >> 6) + 2;
    }
  }
  if ((uVar3 >> 8 & 1) != 0) {
    uVar3 = (this->field_0)._impl_.optional_uint32_5000_ | 1;
    iVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar7 = sVar7 + (iVar1 * 9 + 0x49U >> 6) + 3;
  }
  sVar7 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar7,&(this->field_0)._impl_._cached_size_);
  return sVar7;
}

Assistant:

::size_t TestVerifyBigFieldNumberUint32_Nested::ByteSizeLong() const {
  const TestVerifyBigFieldNumberUint32_Nested& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:edition_unittest.TestVerifyBigFieldNumberUint32.Nested)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .edition_unittest.TestVerifyBigFieldNumberUint32.Nested repeated_nested = 10;
    {
      total_size += 1UL * this_._internal_repeated_nested_size();
      for (const auto& msg : this_._internal_repeated_nested()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    // .edition_unittest.TestVerifyBigFieldNumberUint32.Nested optional_nested = 9;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_nested_);
    }
    // uint32 optional_uint32_1 = 1;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += ::_pbi::WireFormatLite::UInt32SizePlusOne(
          this_._internal_optional_uint32_1());
    }
    // uint32 optional_uint32_2 = 2;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += ::_pbi::WireFormatLite::UInt32SizePlusOne(
          this_._internal_optional_uint32_2());
    }
    // uint32 optional_uint32_63 = 63;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::UInt32Size(
                                      this_._internal_optional_uint32_63());
    }
    // uint32 optional_uint32_64 = 64;
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::UInt32Size(
                                      this_._internal_optional_uint32_64());
    }
    // uint32 optional_uint32_65 = 65;
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::UInt32Size(
                                      this_._internal_optional_uint32_65());
    }
    // uint32 optional_uint32_66 = 66;
    if ((cached_has_bits & 0x00000040u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::UInt32Size(
                                      this_._internal_optional_uint32_66());
    }
    // uint32 optional_uint32_1000 = 1000;
    if ((cached_has_bits & 0x00000080u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::UInt32Size(
                                      this_._internal_optional_uint32_1000());
    }
  }
   {
    // uint32 optional_uint32_5000 = 5000;
    if ((cached_has_bits & 0x00000100u) != 0) {
      total_size += 3 + ::_pbi::WireFormatLite::UInt32Size(
                                      this_._internal_optional_uint32_5000());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}